

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

bool Catch::operator<(TestCaseInfo *lhs,TestCaseInfo *rhs)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  ulong __n;
  bool bVar5;
  
  uVar3 = std::__cxx11::string::compare((string *)lhs);
  if (uVar3 == 0) {
    uVar1 = (rhs->className).m_size;
    uVar2 = (lhs->className).m_size;
    bVar5 = uVar2 < uVar1;
    __n = uVar1;
    if (bVar5) {
      __n = uVar2;
    }
    uVar3 = 0xffffffff;
    if (!bVar5) {
      uVar3 = (uint)(!bVar5 && uVar2 != uVar1);
    }
    uVar4 = strncmp((lhs->className).m_start,(rhs->className).m_start,__n);
    if (uVar4 != 0) {
      uVar3 = uVar4;
    }
    if (uVar3 == 0) {
      bVar5 = std::
              __lexicographical_compare_impl<Catch::Tag_const*,Catch::Tag_const*,__gnu_cxx::__ops::_Iter_less_iter>
                        ((lhs->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                         (lhs->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>.
                         _M_impl.super__Vector_impl_data._M_finish,
                         (rhs->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                         (rhs->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>.
                         _M_impl.super__Vector_impl_data._M_finish);
      return bVar5;
    }
  }
  return SUB41(uVar3 >> 0x1f,0);
}

Assistant:

bool operator<( TestCaseInfo const& lhs, TestCaseInfo const& rhs ) {
        // We want to avoid redoing the string comparisons multiple times,
        // so we store the result of a three-way comparison before using
        // it in the actual comparison logic.
        const auto cmpName = lhs.name.compare( rhs.name );
        if ( cmpName != 0 ) {
            return cmpName < 0;
        }
        const auto cmpClassName = lhs.className.compare( rhs.className );
        if ( cmpClassName != 0 ) {
            return cmpClassName < 0;
        }
        return lhs.tags < rhs.tags;
    }